

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O2

string * iutest::detail::ToHexString<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long value)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  char cVar5;
  allocator<char> local_29;
  char local_28 [32];
  
  pcVar2 = local_28;
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  for (lVar3 = 0x3c; lVar3 != -4; lVar3 = lVar3 + -4) {
    uVar4 = (uint)(value >> ((byte)lVar3 & 0x3f)) & 0xf;
    cVar1 = (char)uVar4;
    cVar5 = cVar1 + '0';
    if (9 < uVar4) {
      cVar5 = cVar1 + '7';
    }
    *pcVar2 = cVar5;
    pcVar2 = pcVar2 + 1;
  }
  local_28[0x10] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28,&local_29);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}